

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_A<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  ArgSlot_OneByte outRegisterID;
  Var aValue;
  
  outRegisterID = (playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Arg;
  aValue = GetReg<unsigned_char>
                     (this,(playout->super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
                           Reg);
  SetOut(this,outRegisterID,aValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_A(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetReg(playout->Reg));
    }